

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 pager_cksum(Pager *pPager,u8 *aData)

{
  int i;
  u32 cksum;
  u8 *aData_local;
  Pager *pPager_local;
  
  cksum = pPager->cksumInit;
  i = (int)pPager->pageSize;
  while (i = i + -200, 0 < i) {
    cksum = aData[i] + cksum;
  }
  return cksum;
}

Assistant:

static u32 pager_cksum(Pager *pPager, const u8 *aData){
  u32 cksum = pPager->cksumInit;         /* Checksum value to return */
  int i = pPager->pageSize-200;          /* Loop counter */
  while( i>0 ){
    cksum += aData[i];
    i -= 200;
  }
  return cksum;
}